

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O0

Bit32u __thiscall
MT32Emu::MidiStreamParserImpl::parseShortMessageStatus(MidiStreamParserImpl *this,Bit8u *stream)

{
  bool bVar1;
  byte local_19;
  Bit32u parsedLength;
  Bit8u status;
  Bit8u *stream_local;
  MidiStreamParserImpl *this_local;
  
  local_19 = *stream;
  _parsedLength = stream;
  stream_local = (Bit8u *)this;
  bVar1 = processStatusByte(this,&local_19);
  if (0x7f < local_19) {
    *this->streamBuffer = local_19;
    this->streamBufferSize = this->streamBufferSize + 1;
  }
  return (uint)!bVar1;
}

Assistant:

Bit32u MidiStreamParserImpl::parseShortMessageStatus(const Bit8u stream[]) {
	Bit8u status = *stream;
	Bit32u parsedLength = processStatusByte(status) ? 0 : 1;
	if (0x80 <= status) { // If no running status available yet, skip one byte
		*streamBuffer = status;
		++streamBufferSize;
	}
	return parsedLength;
}